

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O0

void __thiscall zmq::socket_base_t::~socket_base_t(socket_base_t *this)

{
  ~socket_base_t((socket_base_t *)&this[-1].super_own_t.options.backlog);
  return;
}

Assistant:

zmq::socket_base_t::~socket_base_t ()
{
    if (_mailbox)
        LIBZMQ_DELETE (_mailbox);

    if (_reaper_signaler)
        LIBZMQ_DELETE (_reaper_signaler);

    scoped_lock_t lock (_monitor_sync);
    stop_monitor ();

    zmq_assert (_destroyed);
}